

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_texture_load_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  uint32_t count;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ComponentType CVar5;
  Id IVar6;
  ValueKind VVar7;
  Id IVar8;
  Builder *pBVar9;
  Value *pVVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  Operation *pOVar13;
  Type *pTVar14;
  Op op;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  Id image_id;
  uint num_coords;
  Id coord [3];
  Id offsets [4];
  uint num_coords_full;
  undefined1 in_stack_ffffffffffffff38;
  uint32_t local_c0;
  Id local_bc;
  uint local_b8;
  Id local_b4;
  Builder *local_b0;
  ulong local_a8;
  CallInst *local_a0;
  Id local_94;
  uint local_90;
  uint32_t local_8c;
  Operation *local_88;
  mapped_type *local_80;
  Id local_78 [4];
  Id local_68 [5];
  uint32_t local_54;
  Vector<spv::Id> local_50;
  Id local_38;
  Id local_34;
  
  bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  bVar3 = true;
  if (bVar2) {
    pBVar9 = Converter::Impl::builder(impl);
    local_a0 = instruction;
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_b4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    IVar6 = Converter::Impl::get_type_id(impl,local_b4);
    pmVar11 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&local_b4);
    pCVar1 = local_a0;
    local_b0 = pBVar9;
    bVar2 = spv::Builder::isStorageImageType(pBVar9,IVar6);
    local_c0 = 0;
    pVVar10 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,2);
    pVVar10 = LLVMBC::Internal::resolve_proxy(pVVar10);
    VVar7 = LLVMBC::Value::get_value_kind(pVVar10);
    local_bc = 0;
    if (VVar7 != Undef) {
      pVVar10 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,2);
      local_bc = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      bVar3 = spv::Builder::isMultisampledImageType(local_b0,IVar6);
      if (bVar3) {
        local_c0 = 0x40;
      }
      else {
        local_c0 = 2;
      }
    }
    local_78[2] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_54 = 0;
    local_8c = 0;
    bVar4 = get_image_dimensions(impl,local_b4,&local_54,&local_8c);
    count = local_54;
    bVar3 = local_54 < 4 && bVar4;
    if (local_54 < 4 && bVar4) {
      uVar16 = (ulong)local_54;
      if (uVar16 != 0) {
        uVar19 = 0;
        do {
          pVVar10 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,(int)uVar19 + 3);
          IVar6 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
          local_78[uVar19] = IVar6;
          uVar19 = uVar19 + 1;
        } while (uVar16 != uVar19);
      }
      local_68[0] = 0;
      local_68[1] = 0;
      local_68[2] = 0;
      local_68[3] = 0;
      local_a8 = (ulong)local_8c;
      get_texel_offsets(impl,pCVar1,&local_c0,6,local_8c,local_68,(bool)in_stack_ffffffffffffff38);
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pCVar1;
      pmVar12 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_composite_meta,(key_type *)&local_50);
      local_b8 = pmVar12->access_mask;
      if ((local_b8 & 0x10) != 0) {
        local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_50.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&local_b0->capabilities,(Capability *)&local_50);
      }
      CVar5 = Converter::Impl::get_effective_typed_resource_type(pmVar11->component_type);
      IVar6 = Converter::Impl::get_type_id(impl,CVar5,1,4,false);
      local_80 = pmVar11;
      if ((local_b8 & 0x10) == 0) {
        pOVar13 = Converter::Impl::allocate
                            (impl,(uint)bVar2 * 3 + OpImageFetch,(Value *)pCVar1,IVar6);
        pTVar14 = LLVMBC::Value::getType((Value *)pCVar1);
        pTVar14 = LLVMBC::Type::getStructElementType(pTVar14,0);
        local_88 = pOVar13;
        Converter::Impl::decorate_relaxed_precision(impl,pTVar14,pOVar13->id,true);
      }
      else {
        IVar8 = spv::Builder::makeIntegerType(local_b0,0x20,false);
        local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             &(((CallInst *)
               local_50.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
        *(Id *)&(((CallInst *)
                 local_50.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
             IVar8;
        *(Id *)((long)&(((CallInst *)
                        local_50.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                       type + 4) = IVar6;
        local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_50.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        IVar6 = Converter::Impl::get_struct_type(impl,&local_50,0,"SparseTexel");
        if ((CallInst *)
            local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
          free_in_thread(local_50.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        op = OpImageSparseFetch;
        if (bVar2) {
          op = OpImageSparseRead;
        }
        local_88 = Converter::Impl::allocate(impl,op,(Value *)pCVar1,IVar6);
      }
      pBVar9 = local_b0;
      IVar6 = spv::Builder::makeIntegerType(local_b0,0x20,false);
      local_34 = Converter::Impl::build_vector(impl,IVar6,local_78,count);
      uVar16 = local_a8;
      uVar18 = local_c0;
      if ((local_c0 & 0x10) != 0 && !bVar2) {
        local_90 = local_c0;
        local_94 = local_34;
        if ((uint)local_a8 < count) {
          iVar17 = count - (uint)local_a8;
          lVar15 = 0;
          do {
            IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,true);
            IVar6 = spv::Builder::makeIntConstant(pBVar9,IVar6,0,false);
            local_68[uVar16 + lVar15] = IVar6;
            lVar15 = lVar15 + 1;
          } while (iVar17 != (int)lVar15);
        }
        IVar6 = spv::Builder::makeIntegerType(pBVar9,0x20,true);
        IVar6 = Converter::Impl::build_vector_type(impl,IVar6,count);
        pOVar13 = Converter::Impl::allocate(impl,OpIAdd,IVar6);
        Operation::add_id(pOVar13,local_94);
        uVar18 = local_90;
        IVar6 = build_texel_offset_vector(impl,local_68,count,local_90,false);
        Operation::add_id(pOVar13,IVar6);
        Converter::Impl::add(impl,pOVar13,false);
        local_34 = pOVar13->id;
        uVar18 = uVar18 & 0xffffffef;
      }
      pmVar11 = local_80;
      pOVar13 = local_88;
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = &local_38;
      local_38 = local_b4;
      local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      Operation::add_ids(local_88,(initializer_list<unsigned_int> *)&local_50);
      Operation::add_literal(pOVar13,uVar18);
      pCVar1 = local_a0;
      if (bVar2) {
        if ((uVar18 & 0x40) != 0) {
          Operation::add_id(pOVar13,local_bc);
          pBVar9 = Converter::Impl::builder(impl);
          local_50.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_50.
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1b);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                      *)&pBVar9->capabilities,(Capability *)&local_50);
        }
      }
      else {
        if ((uVar18 & 2) != 0) {
          Operation::add_id(pOVar13,local_bc);
        }
        if ((uVar18 & 8) != 0) {
          IVar6 = build_texel_offset_vector(impl,local_68,(uint)local_a8,uVar18,false);
          Operation::add_id(pOVar13,IVar6);
        }
        if ((uVar18 & 0x40) != 0) {
          Operation::add_id(pOVar13,local_bc);
        }
      }
      Converter::Impl::add(impl,pOVar13,pmVar11->rov);
      pTVar14 = LLVMBC::Value::getType((Value *)pCVar1);
      pTVar14 = LLVMBC::Type::getStructElementType(pTVar14,0);
      CVar5 = pmVar11->component_type;
      if ((local_b8 & 0x10) == 0) {
        Converter::Impl::fixup_load_type_typed(impl,CVar5,4,(Value *)pCVar1,pTVar14);
        build_exploded_composite_from_vector(impl,&pCVar1->super_Instruction,4);
      }
      else {
        Converter::Impl::repack_sparse_feedback(impl,CVar5,4,(Value *)pCVar1,pTVar14,0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool emit_texture_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	bool is_uav = builder.isStorageImageType(image_type_id);
	uint32_t image_ops = 0;

	spv::Id mip_or_sample = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(2)))
	{
		mip_or_sample = impl.get_id_for_value(instruction->getOperand(2));
		if (builder.isMultisampledImageType(image_type_id))
			image_ops |= spv::ImageOperandsSampleMask;
		else
			image_ops |= spv::ImageOperandsLodMask;
	}

	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[4] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 6, num_coords, offsets, false))
		return false;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Op opcode;
	if (is_uav)
		opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
	else
		opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	spv::Id coord_id = impl.build_vector(builder.makeUintType(32), coord, num_coords_full);
	if (!is_uav && (image_ops & spv::ImageOperandsOffsetMask))
	{
		// Don't need fancy features for fetch, just do arith.
		for (unsigned i = num_coords; i < num_coords_full; i++)
			offsets[i] = builder.makeIntConstant(0);
		auto *add_op = impl.allocate(spv::OpIAdd, impl.build_vector_type(builder.makeIntType(32), num_coords_full));
		add_op->add_id(coord_id);
		add_op->add_id(build_texel_offset_vector(impl, offsets, num_coords_full, image_ops, false));
		impl.add(add_op);
		coord_id = add_op->id;
		image_ops &= ~spv::ImageOperandsOffsetMask;
	}

	op->add_ids({ image_id, coord_id });
	op->add_literal(image_ops);

	if (!is_uav)
	{
		if (image_ops & spv::ImageOperandsLodMask)
			op->add_id(mip_or_sample);

		if (image_ops & spv::ImageOperandsConstOffsetMask)
			op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));
	}

	if (image_ops & spv::ImageOperandsSampleMask)
	{
		op->add_id(mip_or_sample);
		if (is_uav)
			impl.builder().addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}